

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::TypeSpecialization
          (GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val,Value **pDstVal,
          bool *redoTypeSpecRef,bool *forceInvariantHoistingRef)

{
  code *pcVar1;
  bool *pbVar2;
  Value **ppVVar3;
  bool bVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  ValueInfo *pVVar7;
  FloatConstantValueInfo *pFVar8;
  Value *pVVar9;
  Opnd *pOVar10;
  RegOpnd *dst_00;
  SymOpnd *pSVar11;
  StackSym *varSym;
  FloatConstType FVar12;
  bool local_12b;
  RegOpnd *dstRegOpnd;
  Opnd *dst;
  Opnd *src2;
  Opnd *src1;
  IntConstantBounds src2IntConstantBounds;
  IntConstantBounds src1IntConstantBounds;
  int32 iStack_b0;
  bool success;
  int32 intConstantValue;
  undefined1 local_a0 [8];
  AutoRestoreVal autoRestoreSrc2Val;
  AutoRestoreVal autoRestoreSrc1Val;
  bool isInt32_1;
  int32 int32Value_1;
  bool isInt32;
  Value *pVStack_60;
  int32 int32Value;
  Value *src2OriginalVal;
  Value *src1OriginalVal;
  Value **src2Val;
  Value **src1Val;
  bool *redoTypeSpecRef_local;
  Value **pDstVal_local;
  Value **pSrc2Val_local;
  Value **pSrc1Val_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  *redoTypeSpecRef = false;
  src1OriginalVal = (Value *)pSrc2Val;
  src2Val = pSrc1Val;
  src1Val = (Value **)redoTypeSpecRef;
  redoTypeSpecRef_local = (bool *)pDstVal;
  pDstVal_local = pSrc2Val;
  pSrc2Val_local = pSrc1Val;
  pSrc1Val_local = (Value **)instr;
  instr_local = (Instr *)this;
  if ((*forceInvariantHoistingRef & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1871,"(!*forceInvariantHoistingRef)","!*forceInvariantHoistingRef");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffb;
  *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffff7;
  src2OriginalVal = *src2Val;
  pVStack_60 = *(Value **)src1OriginalVal;
  bVar4 = IR::Instr::ShouldCheckForIntOverflow((Instr *)pSrc1Val_local);
  if (!bVar4) {
    if (*src2Val != (Value *)0x0) {
      pVVar7 = ::Value::GetValueInfo(*src2Val);
      bVar4 = ValueInfo::IsFloatConstant(pVVar7);
      if (bVar4) {
        pVVar7 = ::Value::GetValueInfo(*src2Val);
        pFVar8 = ValueInfo::AsFloatConstant(pVVar7);
        FVar12 = FloatConstantValueInfo::FloatValue(pFVar8);
        bVar4 = Js::JavascriptNumber::TryGetInt32OrUInt32Value(FVar12,&int32Value_1,&isInt32_1);
        if (bVar4) {
          pVVar9 = GetIntConstantValue(this,int32Value_1,(Instr *)pSrc1Val_local,(Opnd *)0x0);
          *src2Val = pVVar9;
          if ((isInt32_1 & 1U) == 0) {
            *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffb | 4;
          }
        }
      }
    }
    if (*(long *)src1OriginalVal != 0) {
      pVVar7 = ::Value::GetValueInfo(*(Value **)src1OriginalVal);
      bVar4 = ValueInfo::IsFloatConstant(pVVar7);
      if (bVar4) {
        pVVar7 = ::Value::GetValueInfo(*(Value **)src1OriginalVal);
        pFVar8 = ValueInfo::AsFloatConstant(pVVar7);
        FVar12 = FloatConstantValueInfo::FloatValue(pFVar8);
        bVar4 = Js::JavascriptNumber::TryGetInt32OrUInt32Value
                          (FVar12,(int32 *)((long)&autoRestoreSrc1Val.valueRef + 4),
                           (bool *)((long)&autoRestoreSrc1Val.valueRef + 3));
        if (bVar4) {
          pVVar9 = GetIntConstantValue(this,autoRestoreSrc1Val.valueRef._4_4_,
                                       (Instr *)pSrc1Val_local,(Opnd *)0x0);
          *(Value **)src1OriginalVal = pVVar9;
          if ((autoRestoreSrc1Val.valueRef._3_1_ & 1) == 0) {
            *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xfffffffb | 4;
          }
        }
      }
    }
  }
  AutoRestoreVal::AutoRestoreVal
            ((AutoRestoreVal *)&autoRestoreSrc2Val.valueRef,src2OriginalVal,src2Val);
  AutoRestoreVal::AutoRestoreVal((AutoRestoreVal *)local_a0,pVStack_60,(Value **)src1OriginalVal);
  if ((*src2Val == (Value *)0x0) ||
     (pOVar10 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local), pOVar10 != (Opnd *)0x0)) {
    pOVar10 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
    if ((pOVar10 != (Opnd *)0x0) &&
       ((bVar4 = IR::Instr::IsBranchInstr((Instr *)pSrc1Val_local), !bVar4 &&
        (bVar4 = IsLoopPrePass(this), !bVar4)))) {
      bVar4 = GetIsAsmJSFunc(this);
      if (bVar4) {
        if ((DAT_01e9e243 & 1) != 0) {
          pOVar10 = IR::Instr::GetSrc1((Instr *)pSrc1Val_local);
          bVar4 = IR::Opnd::IsInt64(pOVar10);
          if (bVar4) {
            local_12b = OptConstFoldBinaryWasm<long>
                                  (this,(Instr **)&pSrc1Val_local,*src2Val,
                                   *(Value **)src1OriginalVal,(Value **)redoTypeSpecRef_local);
          }
          else {
            local_12b = OptConstFoldBinaryWasm<int>
                                  (this,(Instr **)&pSrc1Val_local,*src2Val,
                                   *(Value **)src1OriginalVal,(Value **)redoTypeSpecRef_local);
          }
          if (local_12b != false) {
            this_local = (GlobOpt *)pSrc1Val_local;
            goto LAB_00589114;
          }
        }
      }
      else {
        IntConstantBounds::IntConstantBounds(&src2IntConstantBounds);
        IntConstantBounds::IntConstantBounds((IntConstantBounds *)&src1);
        if (*src2Val != (Value *)0x0) {
          pVVar7 = ::Value::GetValueInfo(*src2Val);
          bVar4 = ValueInfo::TryGetIntConstantBounds(pVVar7,&src2IntConstantBounds,false);
          if ((bVar4) && (*(long *)src1OriginalVal != 0)) {
            pVVar7 = ::Value::GetValueInfo(*(Value **)src1OriginalVal);
            bVar4 = ValueInfo::TryGetIntConstantBounds(pVVar7,(IntConstantBounds *)&src1,false);
            if ((bVar4) &&
               (bVar4 = OptConstFoldBinary(this,(Instr **)&pSrc1Val_local,&src2IntConstantBounds,
                                           (IntConstantBounds *)&src1,
                                           (Value **)redoTypeSpecRef_local), bVar4)) {
              this_local = (GlobOpt *)pSrc1Val_local;
              goto LAB_00589114;
            }
          }
        }
      }
    }
  }
  else {
    bVar4 = IsLoopPrePass(this);
    if ((!bVar4) && (bVar4 = IR::Instr::IsBranchInstr((Instr *)pSrc1Val_local), !bVar4)) {
      pVVar7 = ::Value::GetValueInfo(*src2Val);
      bVar4 = ValueInfo::TryGetIntConstantValue(pVVar7,&stack0xffffffffffffff50,false);
      if ((bVar4) &&
         ((((*(short *)(pSrc1Val_local + 6) != 0x9a && (*(short *)(pSrc1Val_local + 6) != 0x9c)) &&
           (*(short *)(pSrc1Val_local + 6) != 0x22c)) &&
          ((*(short *)(pSrc1Val_local + 6) != 0x18b && (*(short *)(pSrc1Val_local + 6) != 0x269)))))
         ) {
        bVar4 = OptConstFoldUnary(this,(Instr **)&pSrc1Val_local,iStack_b0,
                                  *src2Val == src2OriginalVal,(Value **)redoTypeSpecRef_local);
        if (bVar4) {
          this_local = (GlobOpt *)pSrc1Val_local;
          goto LAB_00589114;
        }
        goto LAB_005889bd;
      }
    }
    bVar4 = TypeSpecializeUnary(this,(Instr **)&pSrc1Val_local,src2Val,
                                (Value **)redoTypeSpecRef_local,src2OriginalVal,(bool *)src1Val,
                                forceInvariantHoistingRef);
    if (bVar4) {
      this_local = (GlobOpt *)pSrc1Val_local;
      goto LAB_00589114;
    }
    if (((ulong)*src1Val & 1) != 0) {
      this_local = (GlobOpt *)pSrc1Val_local;
      goto LAB_00589114;
    }
  }
LAB_005889bd:
  pOVar10 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
  if ((pOVar10 == (Opnd *)0x0) ||
     (bVar4 = TypeSpecializeBinary
                        (this,(Instr **)&pSrc1Val_local,pSrc2Val_local,pDstVal_local,
                         (Value **)redoTypeSpecRef_local,src2OriginalVal,pVStack_60,(bool *)src1Val)
     , !bVar4)) {
    if (((ulong)*src1Val & 1) == 0) {
      bVar4 = IR::Instr::IsBranchInstr((Instr *)pSrc1Val_local);
      if (((!bVar4) || (bVar4 = IsLoopPrePass(this), bVar4)) ||
         (bVar4 = OptConstFoldBranch(this,(Instr *)pSrc1Val_local,*src2Val,
                                     *(Value **)src1OriginalVal,(Value **)redoTypeSpecRef_local),
         !bVar4)) {
        pOVar10 = IR::Instr::GetSrc1((Instr *)pSrc1Val_local);
        if (pOVar10 != (Opnd *)0x0) {
          pSrc1Val_local = (Value **)ToVarUses(this,(Instr *)pSrc1Val_local,pOVar10,false,*src2Val);
          pOVar10 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
          if (pOVar10 != (Opnd *)0x0) {
            pSrc1Val_local =
                 (Value **)
                 ToVarUses(this,(Instr *)pSrc1Val_local,pOVar10,false,*(Value **)src1OriginalVal);
          }
        }
        pOVar10 = IR::Instr::GetDst((Instr *)pSrc1Val_local);
        if (pOVar10 != (Opnd *)0x0) {
          pSrc1Val_local =
               (Value **)ToVarUses(this,(Instr *)pSrc1Val_local,pOVar10,true,(Value *)0x0);
          bVar4 = OpCodeAttr::IsInlineBuiltIn(((Instr *)pSrc1Val_local)->m_opcode);
          if ((bVar4) && (bVar4 = GetIsAsmJSFunc(this), !bVar4)) {
            TypeSpecializeInlineBuiltInDst
                      (this,(Instr **)&pSrc1Val_local,(Value **)redoTypeSpecRef_local);
            this_local = (GlobOpt *)pSrc1Val_local;
            goto LAB_00589114;
          }
          bVar4 = IR::Opnd::IsRegOpnd(pOVar10);
          if (bVar4) {
            dst_00 = IR::Opnd::AsRegOpnd(pOVar10);
            bVar4 = StackSym::IsTypeSpec(dst_00->m_sym);
            if (bVar4) {
              bVar4 = StackSym::IsInt32(dst_00->m_sym);
              if (bVar4) {
                ToInt32Dst(this,(Instr *)pSrc1Val_local,dst_00,this->currentBlock);
              }
              else {
                bVar4 = StackSym::IsUInt32(dst_00->m_sym);
                if ((bVar4) && (bVar4 = GetIsAsmJSFunc(this), bVar4)) {
                  ToUInt32Dst(this,(Instr *)pSrc1Val_local,dst_00,this->currentBlock);
                }
                else {
                  bVar4 = StackSym::IsFloat64(dst_00->m_sym);
                  if (bVar4) {
                    ToFloat64Dst(this,(Instr *)pSrc1Val_local,dst_00,this->currentBlock);
                  }
                }
              }
            }
            else {
              ToVarRegOpnd(this,dst_00,this->currentBlock);
            }
          }
          else {
            bVar4 = IR::Opnd::IsSymOpnd(pOVar10);
            if (bVar4) {
              pSVar11 = IR::Opnd::AsSymOpnd(pOVar10);
              bVar4 = Sym::IsStackSym(pSVar11->m_sym);
              if (bVar4) {
                pSVar11 = IR::Opnd::AsSymOpnd(pOVar10);
                varSym = Sym::AsStackSym(pSVar11->m_sym);
                ToVarStackSym(this,varSym,this->currentBlock);
              }
            }
          }
        }
        this_local = (GlobOpt *)pSrc1Val_local;
      }
      else {
        this_local = (GlobOpt *)pSrc1Val_local;
      }
    }
    else {
      this_local = (GlobOpt *)pSrc1Val_local;
    }
    goto LAB_00589114;
  }
  bVar4 = IsLoopPrePass(this);
  if ((!bVar4) && ((*(short *)(pSrc1Val_local + 6) != 6 && (*(short *)(pSrc1Val_local + 6) != 9))))
  {
    bVar4 = IR::Instr::HasBailOutInfo((Instr *)pSrc1Val_local);
    if (bVar4) {
      BVar5 = IR::Instr::GetBailOutKind((Instr *)pSrc1Val_local);
      BVar5 = IR::operator&(BVar5,BailOutOnResultConditions);
      if (BVar5 != BailOutInvalid) goto LAB_00588c73;
    }
    if (*src2Val != (Value *)0x0) {
      pVVar7 = ::Value::GetValueInfo(*src2Val);
      bVar4 = ValueInfo::HasIntConstantValue(pVVar7,false);
      ppVVar3 = pSrc1Val_local;
      if (bVar4) {
        pOVar10 = IR::Instr::GetSrc1((Instr *)pSrc1Val_local);
        pbVar2 = redoTypeSpecRef_local;
        pVVar7 = ::Value::GetValueInfo(*src2Val);
        bVar4 = OptConstPeep(this,(Instr *)ppVVar3,pOVar10,(Value **)pbVar2,pVVar7);
        if (bVar4) {
          this_local = (GlobOpt *)pSrc1Val_local;
          goto LAB_00589114;
        }
        goto LAB_00588c73;
      }
    }
    if (*(long *)src1OriginalVal != 0) {
      pVVar7 = ::Value::GetValueInfo(*(Value **)src1OriginalVal);
      bVar4 = ValueInfo::HasIntConstantValue(pVVar7,false);
      ppVVar3 = pSrc1Val_local;
      if (bVar4) {
        pOVar10 = IR::Instr::GetSrc2((Instr *)pSrc1Val_local);
        pbVar2 = redoTypeSpecRef_local;
        pVVar7 = ::Value::GetValueInfo(*(Value **)src1OriginalVal);
        bVar4 = OptConstPeep(this,(Instr *)ppVVar3,pOVar10,(Value **)pbVar2,pVVar7);
        if (bVar4) {
          this_local = (GlobOpt *)pSrc1Val_local;
          goto LAB_00589114;
        }
      }
    }
  }
LAB_00588c73:
  this_local = (GlobOpt *)pSrc1Val_local;
LAB_00589114:
  pSrc1Val_local = (Value **)this_local;
  AutoRestoreVal::~AutoRestoreVal((AutoRestoreVal *)local_a0);
  AutoRestoreVal::~AutoRestoreVal((AutoRestoreVal *)&autoRestoreSrc2Val.valueRef);
  return (Instr *)this_local;
}

Assistant:

IR::Instr *
GlobOpt::TypeSpecialization(
    IR::Instr *instr,
    Value **pSrc1Val,
    Value **pSrc2Val,
    Value **pDstVal,
    bool *redoTypeSpecRef,
    bool *const forceInvariantHoistingRef)
{
    Value *&src1Val = *pSrc1Val;
    Value *&src2Val = *pSrc2Val;
    *redoTypeSpecRef = false;
    Assert(!*forceInvariantHoistingRef);

    this->ignoredIntOverflowForCurrentInstr = false;
    this->ignoredNegativeZeroForCurrentInstr = false;

    // - Int32 values that can't be tagged are created as float constant values instead because a JavascriptNumber var is needed
    //   for that value at runtime. For the purposes of type specialization, recover the int32 values so that they will be
    //   treated as ints.
    // - If int overflow does not matter for the instruction, we can additionally treat uint32 values as int32 values because
    //   the value resulting from the operation will eventually be converted to int32 anyway
    Value *const src1OriginalVal = src1Val;
    Value *const src2OriginalVal = src2Val;

    if(!instr->ShouldCheckForIntOverflow())
    {
        if(src1Val && src1Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src1Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src1Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
        if(src2Val && src2Val->GetValueInfo()->IsFloatConstant())
        {
            int32 int32Value;
            bool isInt32;
            if(Js::JavascriptNumber::TryGetInt32OrUInt32Value(
                    src2Val->GetValueInfo()->AsFloatConstant()->FloatValue(),
                    &int32Value,
                    &isInt32))
            {
                src2Val = GetIntConstantValue(int32Value, instr);
                if(!isInt32)
                {
                    this->ignoredIntOverflowForCurrentInstr = true;
                }
            }
        }
    }
    const AutoRestoreVal autoRestoreSrc1Val(src1OriginalVal, &src1Val);
    const AutoRestoreVal autoRestoreSrc2Val(src2OriginalVal, &src2Val);

    if (src1Val && instr->GetSrc2() == nullptr)
    {
        // Unary
        // Note make sure that native array StElemI gets to TypeSpecializeStElem. Do this for typed arrays, too?
        int32 intConstantValue;
        if (!this->IsLoopPrePass() &&
            !instr->IsBranchInstr() &&
            src1Val->GetValueInfo()->TryGetIntConstantValue(&intConstantValue) &&
            !(
                // Nothing to fold for element stores. Go into type specialization to see if they can at least be specialized.
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC ||
                instr->m_opcode == Js::OpCode::MultiBr ||
                instr->m_opcode == Js::OpCode::InlineArrayPop
            ))
        {
            if (OptConstFoldUnary(&instr, intConstantValue, src1Val == src1OriginalVal, pDstVal))
            {
                return instr;
            }
        }
        else if (this->TypeSpecializeUnary(
                    &instr,
                    &src1Val,
                    pDstVal,
                    src1OriginalVal,
                    redoTypeSpecRef,
                    forceInvariantHoistingRef))
        {
            return instr;
        }
        else if(*redoTypeSpecRef)
        {
            return instr;
        }
    }
    else if (instr->GetSrc2() && !instr->IsBranchInstr())
    {
        // Binary
        if (!this->IsLoopPrePass())
        {
            if (GetIsAsmJSFunc())
            {
                if (CONFIG_FLAG(WasmFold))
                {
                    bool success = instr->GetSrc1()->IsInt64() ?
                        this->OptConstFoldBinaryWasm<int64>(&instr, src1Val, src2Val, pDstVal) :
                        this->OptConstFoldBinaryWasm<int>(&instr, src1Val, src2Val, pDstVal);

                    if (success)
                    {
                        return instr;
                    }
                }
            }
            else
            {
                // OptConstFoldBinary doesn't do type spec, so only deal with things we are sure are int (IntConstant and IntRange)
                // and not just likely ints  TypeSpecializeBinary will deal with type specializing them and fold them again
                IntConstantBounds src1IntConstantBounds, src2IntConstantBounds;
                if (src1Val && src1Val->GetValueInfo()->TryGetIntConstantBounds(&src1IntConstantBounds))
                {
                    if (src2Val && src2Val->GetValueInfo()->TryGetIntConstantBounds(&src2IntConstantBounds))
                    {
                        if (this->OptConstFoldBinary(&instr, src1IntConstantBounds, src2IntConstantBounds, pDstVal))
                        {
                            return instr;
                        }
                    }
                }
            }
        }
    }
    if (instr->GetSrc2() && this->TypeSpecializeBinary(&instr, pSrc1Val, pSrc2Val, pDstVal, src1OriginalVal, src2OriginalVal, redoTypeSpecRef))
    {
        if (!this->IsLoopPrePass() &&
            instr->m_opcode != Js::OpCode::Nop &&
            instr->m_opcode != Js::OpCode::Br &&    // We may have const fold a branch

            // Cannot const-peep if the result of the operation is required for a bailout check
            !(instr->HasBailOutInfo() && instr->GetBailOutKind() & IR::BailOutOnResultConditions))
        {
            if (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc1(), pDstVal, src1Val->GetValueInfo()))
                {
                    return instr;
                }
            }
            else if (src2Val && src2Val->GetValueInfo()->HasIntConstantValue())
            {
                if (this->OptConstPeep(instr, instr->GetSrc2(), pDstVal, src2Val->GetValueInfo()))
                {
                    return instr;
                }
            }
        }
        return instr;
    }
    else if(*redoTypeSpecRef)
    {
        return instr;
    }

    if (instr->IsBranchInstr() && !this->IsLoopPrePass())
    {
        if (this->OptConstFoldBranch(instr, src1Val, src2Val, pDstVal))
        {
            return instr;
        }
    }
    // We didn't type specialize, make sure the srcs are unspecialized
    IR::Opnd *src1 = instr->GetSrc1();
    if (src1)
    {
        instr = this->ToVarUses(instr, src1, false, src1Val);

        IR::Opnd *src2 = instr->GetSrc2();
        if (src2)
        {
            instr = this->ToVarUses(instr, src2, false, src2Val);
        }
    }

    IR::Opnd *dst = instr->GetDst();
    if (dst)
    {
        instr = this->ToVarUses(instr, dst, true, nullptr);

        // Handling for instructions other than built-ins that may require only dst type specialization
        // should be added here.
        if(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode) && !GetIsAsmJSFunc()) // don't need to do typespec for asmjs
        {
            this->TypeSpecializeInlineBuiltInDst(&instr, pDstVal);
            return instr;
        }

        // Clear the int specialized bit on the dst.
        if (dst->IsRegOpnd())
        {
            IR::RegOpnd *dstRegOpnd = dst->AsRegOpnd();
            if (!dstRegOpnd->m_sym->IsTypeSpec())
            {
                this->ToVarRegOpnd(dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsInt32())
            {
                this->ToInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsUInt32() && GetIsAsmJSFunc())
            {
                this->ToUInt32Dst(instr, dstRegOpnd, this->currentBlock);
            }
            else if (dstRegOpnd->m_sym->IsFloat64())
            {
                this->ToFloat64Dst(instr, dstRegOpnd, this->currentBlock);
            }
        }
        else if (dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsStackSym())
        {
            this->ToVarStackSym(dst->AsSymOpnd()->m_sym->AsStackSym(), this->currentBlock);
        }
    }

    return instr;
}